

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

int __thiscall P_QReset::match(P_QReset *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  int local_c;
  
  local_c = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].st.qcount,&local_c);
  piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1].iseq;
  *piVar1 = *piVar1 + 1;
  return 0;
}

Assistant:

int P_QReset::match(vector<StateP> &stk) {
    stk.back().st.qcount.push_back(0);
    stk.back().iseq++;
    return 0;
}